

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

Tee * kj::newTee(Tee *__return_storage_ptr__,Own<kj::AsyncInputStream> *input,uint64_t limit)

{
  uint *puVar1;
  AsyncInputStream *pAVar2;
  Disposer *pDVar3;
  AsyncTee *pAVar4;
  Refcounted *refcounted;
  Own<kj::(anonymous_namespace)::AsyncTee> impl;
  Own<kj::AsyncInputStream> local_68;
  int local_4c;
  Own<kj::(anonymous_namespace)::AsyncTee> local_48;
  Own<kj::(anonymous_namespace)::AsyncTee> local_38;
  Own<kj::(anonymous_namespace)::TeeBranch> local_28;
  
  pAVar4 = (AsyncTee *)operator_new(0x278);
  local_68.disposer = input->disposer;
  pAVar2 = input->ptr;
  input->ptr = (AsyncInputStream *)0x0;
  (pAVar4->super_Refcounted).refcount = 0;
  (pAVar4->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)&PTR_disposeImpl_0067a6a0
  ;
  (pAVar4->inner).disposer = local_68.disposer;
  local_68.ptr = (AsyncInputStream *)0x0;
  (pAVar4->inner).ptr = pAVar2;
  pAVar4->bufferSizeLimit = limit;
  (*pAVar2->_vptr_AsyncInputStream[2])(&pAVar4->length);
  pAVar4->branches[0].ptr.isSet = false;
  pAVar4->branches[1].ptr.isSet = false;
  (pAVar4->stoppage).ptr.isSet = false;
  Promise<void>::Promise(&pAVar4->pullPromise);
  pAVar4->pulling = false;
  puVar1 = &(pAVar4->super_Refcounted).refcount;
  *puVar1 = *puVar1 + 1;
  local_38.disposer = (Disposer *)pAVar4;
  local_38.ptr = pAVar4;
  Own<kj::AsyncInputStream>::dispose(&local_68);
  puVar1 = &(pAVar4->super_Refcounted).refcount;
  *puVar1 = *puVar1 + 1;
  local_4c = 0;
  local_48.disposer = (Disposer *)pAVar4;
  local_48.ptr = pAVar4;
  heap<kj::(anonymous_namespace)::TeeBranch,kj::Own<kj::(anonymous_namespace)::AsyncTee>,int>
            ((kj *)&local_28,&local_48,&local_4c);
  local_68.disposer = local_28.disposer;
  local_68.ptr = &(local_28.ptr)->super_AsyncInputStream;
  local_28.ptr = (TeeBranch *)0x0;
  Own<kj::(anonymous_namespace)::TeeBranch>::~Own(&local_28);
  Own<kj::(anonymous_namespace)::AsyncTee>::~Own(&local_48);
  local_4c = 1;
  heap<kj::(anonymous_namespace)::TeeBranch,kj::Own<kj::(anonymous_namespace)::AsyncTee>,int>
            ((kj *)&local_48,&local_38,&local_4c);
  pAVar4 = local_48.ptr;
  pDVar3 = local_48.disposer;
  local_28.disposer = local_48.disposer;
  local_48.ptr = (AsyncTee *)0x0;
  Own<kj::(anonymous_namespace)::TeeBranch>::~Own
            ((Own<kj::(anonymous_namespace)::TeeBranch> *)&local_48);
  pAVar2 = local_68.ptr;
  local_68.ptr = (AsyncInputStream *)0x0;
  __return_storage_ptr__->branches[0].disposer = local_68.disposer;
  __return_storage_ptr__->branches[0].ptr = pAVar2;
  __return_storage_ptr__->branches[1].disposer = pDVar3;
  __return_storage_ptr__->branches[1].ptr = (AsyncInputStream *)pAVar4;
  local_28.ptr = (TeeBranch *)0x0;
  Own<kj::AsyncInputStream>::dispose((Own<kj::AsyncInputStream> *)&local_28);
  Own<kj::AsyncInputStream>::dispose(&local_68);
  Own<kj::(anonymous_namespace)::AsyncTee>::~Own(&local_38);
  return __return_storage_ptr__;
}

Assistant:

Tee newTee(Own<AsyncInputStream> input, uint64_t limit) {
  auto impl = refcounted<AsyncTee>(mv(input), limit);
  Own<AsyncInputStream> branch1 = heap<TeeBranch>(addRef(*impl), 0);
  Own<AsyncInputStream> branch2 = heap<TeeBranch>(mv(impl), 1);
  return { { mv(branch1), mv(branch2) } };
}